

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
          (internal *this,null_terminating_iterator<char> it,
          id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
          *handler)

{
  internal iVar1;
  uint id;
  internal *piVar2;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
  *this_00;
  internal *piVar3;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *pfVar4;
  null_terminating_iterator<char> nVar5;
  basic_string_view<char> name;
  null_terminating_iterator<char> local_48;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_38;
  type local_28;
  
  this_00 = (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
             *)it.end_;
  piVar3 = (internal *)it.ptr_;
  local_48.end_ = (char *)piVar3;
  local_48.ptr_ = (char *)this;
  if (this == piVar3) {
    iVar1 = (internal)0x0;
LAB_00117a21:
    if ((iVar1 != (internal)0x5f) && (0x19 < (byte)(((byte)iVar1 & 0xdf) + 0xbf))) {
      id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
      ::on_error(this_00,"invalid format string");
      local_48.end_ = (char *)piVar3;
      goto LAB_00117aa4;
    }
    name.size_ = 0;
    piVar2 = this + 1;
    do {
      local_48.ptr_ = (char *)piVar2;
      if ((internal *)local_48.ptr_ == piVar3) {
        iVar1 = (internal)0x0;
      }
      else {
        iVar1 = (internal)*local_48.ptr_;
      }
      piVar2 = (internal *)local_48.ptr_ + 1;
      name.size_ = name.size_ + 1;
    } while ((((byte)((char)iVar1 - 0x30U) < 10) || (iVar1 == (internal)0x5f)) ||
            ((byte)(((byte)iVar1 & 0xdf) + 0xbf) < 0x1a));
    if ((long)name.size_ < 0) {
      __assert_fail("(value >= 0) && \"negative value\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/3rdparty/fmt/include/fmt/core.h"
                    ,0xd3,
                    "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
                   );
    }
    pfVar4 = this_00->handler;
    name.data_ = (char *)this;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
    get_arg((format_arg *)&local_38.string,&pfVar4->context,name);
  }
  else {
    iVar1 = *this;
    if ((iVar1 != (internal)0x7d) && (iVar1 != (internal)0x3a)) {
      if ((byte)((char)iVar1 - 0x30U) < 10) {
        id = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>&>
                       (&local_48,this_00);
        if ((local_48.ptr_ == local_48.end_) ||
           (((internal)*local_48.ptr_ != (internal)0x3a &&
            ((internal)*local_48.ptr_ != (internal)0x7d)))) {
          id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
          ::on_error(this_00,"invalid format string");
        }
        else {
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ::on_arg_id(this_00->handler,id);
        }
        goto LAB_00117aa4;
      }
      goto LAB_00117a21;
    }
    pfVar4 = this_00->handler;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
    next_arg((format_arg *)&local_38.string,&pfVar4->context);
  }
  (pfVar4->arg).type_ = local_28;
  (pfVar4->arg).value_.field_0.long_long_value = local_38.long_long_value;
  (pfVar4->arg).value_.field_0.string.size = local_38.string.size;
  local_48.end_ = (char *)piVar3;
LAB_00117aa4:
  nVar5.end_ = local_48.end_;
  nVar5.ptr_ = local_48.ptr_;
  return nVar5;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(pointer_from(start), to_unsigned(it - start)));
  return it;
}